

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::SourceTreeDescriptorDatabase::SingleFileErrorCollector::
~SingleFileErrorCollector(SingleFileErrorCollector *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_ErrorCollector)._vptr_ErrorCollector =
       (_func_int **)&PTR__SingleFileErrorCollector_0042b400;
  pcVar2 = (this->filename_)._M_dataplus._M_p;
  paVar1 = &(this->filename_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  io::ErrorCollector::~ErrorCollector(&this->super_ErrorCollector);
  return;
}

Assistant:

~SingleFileErrorCollector() {}